

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_login(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  ProcErrorProc *pPVar1;
  Tcl_Interp *pTVar2;
  int iVar3;
  Tcl_Obj *pTVar4;
  Tcl_HashEntry *errorCode;
  CK_RV chk_rv;
  CK_SLOT_ID slotid;
  int tcl_rv;
  int password_len;
  char *password;
  long slotid_long;
  Tcl_Obj *tcl_password;
  Tcl_Obj *tcl_slotid;
  Tcl_Obj *tcl_handle;
  Tcl_HashEntry *tcl_handle_entry;
  tclpkcs11_handle *handle;
  tclpkcs11_interpdata *interpdata;
  Tcl_Obj **objv_local;
  Tcl_Interp *pTStack_20;
  int objc_local;
  Tcl_Interp *interp_local;
  ClientData cd_local;
  
  interpdata = (tclpkcs11_interpdata *)objv;
  objv_local._4_4_ = objc;
  pTStack_20 = interp;
  interp_local = (Tcl_Interp *)cd;
  if (cd == (ClientData)0x0) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid clientdata",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar4);
    return 1;
  }
  if (objc != 4) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)
                       ("wrong # args: should be \"pki::pkcs11::login handle slot password\"",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar4);
    return 1;
  }
  tcl_slotid = objv[1];
  tcl_password = objv[2];
  slotid_long = (long)objv[3];
  handle = (tclpkcs11_handle *)cd;
  tcl_handle = (Tcl_Obj *)(**(code **)((long)cd + 0x40))(cd,tcl_slotid);
  pTVar2 = pTStack_20;
  if (tcl_handle == (Tcl_Obj *)0x0) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
    (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
    return 1;
  }
  tcl_handle_entry = (Tcl_HashEntry *)tcl_handle->typePtr;
  if ((Tcl_ObjType *)tcl_handle_entry != (Tcl_ObjType *)0x0) {
    slotid._0_4_ = (*tclStubsPtr->tcl_GetLongFromObj)
                             ((Tcl_Interp_conflict *)pTStack_20,tcl_password,(long *)&password);
    if ((int)slotid != 0) {
      return (int)slotid;
    }
    iVar3 = tclpkcs11_start_session((tclpkcs11_handle *)tcl_handle_entry,(CK_SLOT_ID)password);
    pTVar2 = pTStack_20;
    if ((long)iVar3 != 0) {
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar4 = tclpkcs11_pkcs11_error((long)iVar3);
      (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
      return 1;
    }
    _tcl_rv = (*tclStubsPtr->tcl_GetStringFromObj)
                        ((Tcl_Obj *)slotid_long,(int *)((long)&slotid + 4));
    errorCode = (*tcl_handle_entry->tablePtr[1].findProc)
                          ((Tcl_HashTable *)(tcl_handle_entry->key).oneWordValue,(char *)0x1);
    pTVar2 = pTStack_20;
    if (errorCode != (Tcl_HashEntry *)0x0) {
      if (errorCode == (Tcl_HashEntry *)0xa0) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(0);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
        return 0;
      }
      if (errorCode != (Tcl_HashEntry *)0x100) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar4 = tclpkcs11_pkcs11_error((CK_RV)errorCode);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
        return 1;
      }
    }
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(1);
    (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
    return 0;
  }
  pPVar1 = tclStubsPtr->tcl_SetObjResult;
  pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
  (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_login(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid, *tcl_password;
  long slotid_long;
  char *password;
  int password_len;
  int tcl_rv;

  CK_SLOT_ID slotid;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 4) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::login handle slot password\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];
  tcl_password = objv[3];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  password = Tcl_GetStringFromObj(tcl_password, &password_len);

  chk_rv = handle->pkcs11->C_Login(handle->session, CKU_USER, (CK_UTF8CHAR_PTR) password, password_len);
  switch (chk_rv) {
    case CKR_OK:
    case CKR_USER_ALREADY_LOGGED_IN:
      Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));

      break;
    case CKR_PIN_INCORRECT:
      Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));

      break;
    default:
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      return(TCL_ERROR);
  }

  return(TCL_OK);
}